

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream.h
# Opt level: O2

void fmt::v5::internal::write<wchar_t>
               (basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *os,basic_buffer<wchar_t> *buf)

{
  size_t sVar1;
  wchar_t *pwVar2;
  ulong uVar3;
  
  pwVar2 = buf->ptr_;
  sVar1 = buf->size_;
  do {
    uVar3 = 0x7fffffffffffffff;
    if (sVar1 < 0x7fffffffffffffff) {
      uVar3 = sVar1;
    }
    std::wostream::write((wchar_t *)os,(long)pwVar2);
    pwVar2 = pwVar2 + uVar3;
    sVar1 = sVar1 - uVar3;
  } while (sVar1 != 0);
  return;
}

Assistant:

void write(std::basic_ostream<Char> &os, basic_buffer<Char> &buf) {
  const Char *data = buf.data();
  typedef std::make_unsigned<std::streamsize>::type UnsignedStreamSize;
  UnsignedStreamSize size = buf.size();
  UnsignedStreamSize max_size =
      internal::to_unsigned((std::numeric_limits<std::streamsize>::max)());
  do {
    UnsignedStreamSize n = size <= max_size ? size : max_size;
    os.write(data, static_cast<std::streamsize>(n));
    data += n;
    size -= n;
  } while (size != 0);
}